

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v5::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  undefined4 error_code;
  int extraout_EAX;
  unsigned_long_long in_RCX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  in_RDX;
  string_view format_str;
  format_args args;
  v5 local_2f0 [32];
  runtime_error local_2d0 [16];
  system_error *local_2c0;
  runtime_error *base;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  local_2a8;
  unsigned_long_long uStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  string_view local_278 [2];
  allocator<char> local_251;
  undefined1 local_250 [8];
  memory_buffer buffer;
  int err_code_local;
  system_error *this_local;
  format_args args_local;
  string_view format_str_local;
  
  buffer._532_4_ = SUB84(ctx,0);
  this->error_code_ = buffer._532_4_;
  args_local.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1 = in_RDX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250,&local_251);
  std::allocator<char>::~allocator(&local_251);
  error_code = buffer._532_4_;
  local_2a8 = args_local.
              super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              .field_1;
  uStack_2a0 = in_RCX;
  format_args::format_args<fmt::v5::format_args&>((format_args *)&base,(format_args *)&this_local);
  format_str.size_ = (size_t)local_2a8.values_;
  format_str.data_ = (char *)local_298;
  args.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)base;
  args.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .types_ = uStack_2a0;
  vformat_abi_cxx11_(format_str,args);
  basic_string_view<char>::basic_string_view<std::char_traits<char>>(local_278,local_298);
  format_system_error((buffer *)local_250,error_code,local_278[0]);
  std::__cxx11::string::~string((string *)local_298);
  local_2c0 = this;
  to_string<char,500ul>
            (local_2f0,(basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250);
  std::runtime_error::runtime_error(local_2d0,(string *)local_2f0);
  std::runtime_error::operator=(&local_2c0->super_runtime_error,local_2d0);
  std::runtime_error::~runtime_error(local_2d0);
  std::__cxx11::string::~string((string *)local_2f0);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void system_error::init(
    int err_code, string_view format_str, format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error &base = *this;
  base = std::runtime_error(to_string(buffer));
}